

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O0

int EVP_PKEY_set_type(EVP_PKEY *pkey,int type)

{
  EVP_PKEY_ASN1_METHOD *method;
  EVP_PKEY_ASN1_METHOD *ameth;
  int type_local;
  EVP_PKEY *pkey_local;
  
  if ((pkey != (EVP_PKEY *)0x0) && (*(long *)&pkey->references != 0)) {
    free_it((EVP_PKEY *)pkey);
  }
  method = evp_pkey_asn1_find(type);
  if (method == (EVP_PKEY_ASN1_METHOD *)0x0) {
    ERR_put_error(6,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp.cc"
                  ,0xde);
    ERR_add_error_dataf("algorithm %d",(ulong)(uint)type);
    pkey_local._4_4_ = 0;
  }
  else {
    if (pkey != (EVP_PKEY *)0x0) {
      evp_pkey_set_method((EVP_PKEY *)pkey,method);
    }
    pkey_local._4_4_ = 1;
  }
  return pkey_local._4_4_;
}

Assistant:

int EVP_PKEY_set_type(EVP_PKEY *pkey, int type) {
  if (pkey && pkey->pkey) {
    // This isn't strictly necessary, but historically |EVP_PKEY_set_type| would
    // clear |pkey| even if |evp_pkey_asn1_find| failed, so we preserve that
    // behavior.
    free_it(pkey);
  }

  const EVP_PKEY_ASN1_METHOD *ameth = evp_pkey_asn1_find(type);
  if (ameth == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    ERR_add_error_dataf("algorithm %d", type);
    return 0;
  }

  if (pkey) {
    evp_pkey_set_method(pkey, ameth);
  }

  return 1;
}